

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::diversify(Solver *this,int rank,int size)

{
  uint64_t uVar1;
  int iVar2;
  int64_t iVar3;
  
  if ((rank == 0) || (2 < size && rank == 1)) {
    this->receiveClauses = false;
  }
  if (rank == 1) {
    this->use_ccnr = false;
    uVar1 = 1000000000;
    goto LAB_0011b180;
  }
  if (rank < 2) {
    return;
  }
  if (rank * -0x55555555 + 0xaaaaaaaaU < 0x55555555) {
    this->invert_pol = true;
  }
  if ((uint)rank % 5 == 3) {
    (this->restart).savedDecisions = 0;
    (this->restart).savedPropagations = 0;
    (this->restart).partialRestarts = 0;
    (this->restart).selection_type = 1;
  }
  else if ((uint)rank % 5 == 2) {
    *(undefined8 *)((long)&(this->restart).savedPropagations + 4) = 0;
    *(undefined8 *)((long)&(this->restart).partialRestarts + 4) = 0;
    (this->restart).savedDecisions = 0;
    (this->restart).savedPropagations = 0;
  }
  if (rank * -0x49249249 + 0xdb6db6dbU < 0x24924925) {
    this->core_lbd_cut = 4;
  }
  iVar2 = rank - ((uint)rank / 0xb + ((uint)rank / 0xb) * 10);
  if (iVar2 == 4) {
    iVar2 = 2;
LAB_0011b241:
    this->init_act = iVar2;
  }
  else if (iVar2 == 7) {
    iVar2 = 3;
    goto LAB_0011b241;
  }
  if (rank * -0x3b13b13b + 0xd89d89d8U < 0x13b13b14) {
    this->var_decay_timer = 100000;
    this->var_decay_timer_init = 100000;
  }
  if (rank * -0xf0f0f0f + 0x3c3c3c3cU < 0xf0f0f0f) {
    this->var_decay = 0.999;
  }
  if ((uint)rank % 0x13 == 6) {
    iVar2 = 1;
    uVar1 = 2000;
LAB_0011b2cd:
    this->inprocess_next_lim = uVar1;
    this->inprocess_learnt_level = iVar2;
  }
  else if ((uint)rank % 0x13 == 9) {
    iVar2 = 2;
    uVar1 = 3000;
    goto LAB_0011b2cd;
  }
  iVar2 = (uint)rank / 0x17 + ((uint)rank / 0x17) * -0x18 + rank;
  if (iVar2 == 5) {
    iVar3 = 10;
LAB_0011b307:
    this->chrono = iVar3;
  }
  else if (iVar2 == 6) {
    iVar3 = 5;
    goto LAB_0011b307;
  }
  iVar2 = rank + ((uint)rank / 0x1d) * -2 + ((uint)rank / 0x1d) * -0x1b;
  if (iVar2 == 6) {
    uVar1 = 1000;
  }
  else if (iVar2 == 10) {
    uVar1 = 5000;
  }
  else {
    if (iVar2 != 8) {
      return;
    }
    uVar1 = 3000;
  }
LAB_0011b180:
  this->state_change_time = uVar1;
  return;
}

Assistant:

void Solver::diversify(int rank, int size)
{
    /* rank ranges from 0 to size-1 */

    /* keep first 2 configurations as is, and do not receive clause! */
    if (rank == 0 || (rank == 1 && size > 2)) {
        receiveClauses = false;
    }
    if (rank == 1) {
        use_ccnr = false;
        state_change_time = 1000000000;
    }
    if (rank < 2) return;

    /* allow many combinations of configurations for large ranks! */
    if (rank % 3 == 2) invert_pol = true;
    if (rank % 5 == 2) restart = Restart(0);
    if (rank % 5 == 3) restart = Restart(1);
    if (rank % 7 == 3) core_lbd_cut = 4;
    if (rank % 11 == 4) init_act = 2;
    if (rank % 11 == 7) init_act = 3;
    if (rank % 13 == 8) {
        var_decay_timer = 100000;
        var_decay_timer_init = 100000;
    }
    if (rank % 17 == 4) var_decay = 0.999;
    if (rank % 19 == 6) {
        inprocess_next_lim = 2000;
        inprocess_learnt_level = 1;
    }
    if (rank % 19 == 9) {
        inprocess_next_lim = 3000;
        inprocess_learnt_level = 2;
    }
    if (rank % 23 == 5) chrono = 10;
    if (rank % 23 == 6) chrono = 5;
    if (rank % 29 == 6) state_change_time = 1000;
    if (rank % 29 == 8) state_change_time = 3000;
    if (rank % 29 == 10) state_change_time = 5000;
}